

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_iterate(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  size_t sVar2;
  size_t i;
  size_t k;
  int k_1;
  bitset_t *b;
  size_t in_stack_ffffffffffffffd8;
  bitset_t *in_stack_ffffffffffffffe0;
  long lVar3;
  long local_18;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  bitset = bitset_create();
  for (iVar4 = 0; iVar4 < 1000; iVar4 = iVar4 + 1) {
    bitset_set(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  sVar2 = bitset_count(in_stack_ffffffffffffffe0);
  if (sVar2 != 1000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_iterate",0x12);
    exit(1);
  }
  local_18 = 0;
  lVar3 = 0;
  while( true ) {
    _Var1 = bitset_next_set_bit(bitset,(size_t *)CONCAT44(iVar4,in_stack_fffffffffffffff0));
    if (!_Var1) break;
    if (lVar3 != local_18) {
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_iterate",0x15);
      exit(1);
    }
    local_18 = local_18 + 3;
    lVar3 = lVar3 + 1;
  }
  if (local_18 != 3000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_iterate",0x18);
    exit(1);
  }
  bitset_free((bitset_t *)0x10130d);
  return;
}

Assistant:

void test_iterate() {
  bitset_t *b = bitset_create();
  for (int k = 0; k < 1000; ++k)
    bitset_set(b, 3 * k);
  TEST_ASSERT(bitset_count(b) == 1000);
  size_t k = 0;
  for (size_t i = 0; bitset_next_set_bit(b, &i); i++) {
    TEST_ASSERT(i == k);
    k += 3;
  }
  TEST_ASSERT(k == 3000);
  bitset_free(b);
}